

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

ON_BrepLoop * __thiscall ON_Brep::NewLoop(ON_Brep *this,TYPE looptype)

{
  int iVar1;
  ON_BrepLoop *pOVar2;
  ON_BrepLoop *loop;
  int li;
  TYPE looptype_local;
  ON_Brep *this_local;
  
  ON_BoundingBox::Destroy(&this->m_bbox);
  this->m_is_solid = 0;
  iVar1 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
  ON_ClassArray<ON_BrepLoop>::Reserve((ON_ClassArray<ON_BrepLoop> *)&this->m_L,(long)(iVar1 + 1));
  ON_ClassArray<ON_BrepLoop>::SetCount((ON_ClassArray<ON_BrepLoop> *)&this->m_L,iVar1 + 1);
  pOVar2 = ON_ClassArray<ON_BrepLoop>::Array((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
  pOVar2 = pOVar2 + iVar1;
  pOVar2->m_loop_index = iVar1;
  pOVar2->m_type = looptype;
  pOVar2->m_brep = this;
  return pOVar2;
}

Assistant:

ON_BrepLoop& 
ON_Brep::NewLoop( ON_BrepLoop::TYPE looptype )
{
  // 2 Sept 2020 S. Baer (RH-59952)
  // Destroy cached bounding box on breps when messing around with loops
  m_bbox.Destroy();
  m_is_solid = 0;
  int li = m_L.Count();
  m_L.Reserve(li+1);
  m_L.SetCount(li+1);
  ON_BrepLoop& loop =  m_L.Array()[li];
  loop.m_loop_index = li;
  loop.m_type = looptype;
  loop.m_brep = this;
  return loop;
}